

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarray2.c
# Opt level: O2

void * SparseArrayFind(SparseArray *sarray,uint32_t *index)

{
  SparseArray *sarray_00;
  uint32_t uVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar2 = *index;
  uVar5 = uVar2 >> ((byte)sarray->shift & 0x1f);
  if (sarray->shift == 0) {
    for (uVar4 = (ulong)(uVar5 & 0xff); uVar2 = uVar2 + 1, uVar4 != 0x100; uVar4 = uVar4 + 1) {
      if (sarray->data[uVar4] != (void *)0x0) {
        return sarray->data[uVar4];
      }
      *index = uVar2;
    }
  }
  else {
    uVar5 = uVar5 & 0xff;
    while (uVar5 != 0xff) {
      uVar1 = sarray->shift;
      uVar4 = (ulong)uVar5;
      while (uVar6 = uVar4 + 1, uVar6 != 0x100) {
        sarray_00 = (SparseArray *)sarray->data[uVar4];
        uVar4 = uVar6;
        if ((((sarray_00 == &EmptyArray24) || (sarray_00 == &EmptyArray16)) ||
            (sarray_00 == &EmptyArray)) || (sarray_00 == &EmptyArray8)) {
          *index = (1 << ((byte)sarray->shift & 0x1f)) + *index &
                   ~((0xff << ((byte)uVar1 & 0x1f)) >> 8);
        }
        else {
          pvVar3 = SparseArrayFind(sarray_00,index);
          if (pvVar3 != (void *)0x0) {
            return pvVar3;
          }
        }
      }
      uVar5 = 0xff;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *SparseArrayFind(SparseArray * sarray, uint32_t * index)
{
	uint32_t j = MASK_INDEX((*index));
	uint32_t max = MAX_INDEX(sarray);
	if (sarray->shift == 0)
	{
		while (j<=max)
		{
			if (sarray->data[j] != SARRAY_EMPTY)
			{
				return sarray->data[j];
			}
			(*index)++;
			j++;
		}
	}
	else while (j<max)
	{
		// If the shift is not 0, then we need to recursively look at child
		// nodes.
		uint32_t zeromask = ~((0xff << sarray->shift) >> base_shift);
		while (j<max)
		{
			//Look in child nodes
			SparseArray *child = sarray->data[j];
			// Skip over known-empty children
			if ((&EmptyArray == child) ||
			    (&EmptyArray8 == child) ||
			    (&EmptyArray16 == child) ||
			    (&EmptyArray24 == child))
			{
				//Add 2^n to index so j is still correct
				(*index) += 1<<sarray->shift;
				//Zero off the next component of the index so we don't miss any.
				*index &= zeromask;
			}
			else
			{
				// The recursive call will set index to the correct value for
				// the next index, but won't update j
				void * ret = SparseArrayFind(child, index);
				if (ret != SARRAY_EMPTY)
				{
					return ret;
				}
			}
			//Go to the next child
			j++;
		}
	}
	return SARRAY_EMPTY;
}